

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O3

void __thiscall
cppnet::BaseLogger::Warn
          (BaseLogger *this,char *file,uint32_t line,char *content,__va_list_tag *list)

{
  uint32_t len;
  char *buf;
  element_type *peVar1;
  uint32_t uVar2;
  int iVar3;
  shared_ptr<cppnet::Log> log;
  undefined8 *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((this->_level & 4) != 0) {
    GetLog((BaseLogger *)&stack0xffffffffffffffc0);
    buf = (char *)*local_40;
    len = *(uint32_t *)(local_40 + 1);
    uVar2 = FormatLog(file,line,"WAR",buf,len);
    iVar3 = vsnprintf(buf + uVar2,(ulong)(len - uVar2),content,list);
    *(uint32_t *)(local_40 + 1) = iVar3 + uVar2;
    peVar1 = (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (**(code **)(*(long *)peVar1 + 0x20))(peVar1,&stack0xffffffffffffffc0);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
  }
  return;
}

Assistant:

void BaseLogger::Warn(const char* file, uint32_t line, const char* content, va_list list) {
    if (!(_level & LLM_WARN)) {
        return;
    }

    std::shared_ptr<Log> log = GetLog();
    log->_len = FormatLog(file, line, "WAR", content, list, log->_log, log->_len);

    if (_logger) {
        _logger->Warn(log);
    }
}